

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CreateProgram::CreateProgram
          (CreateProgram *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,bool useSync,
          bool serverSync)

{
  Program *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_58;
  SharedPtr<tcu::ThreadUtil::Event> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_38;
  
  Operation::Operation(&this->super_Operation,"CreateProgram",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateProgram_01e085e8;
  (this->m_program).m_ptr = (Program *)0x0;
  (this->m_program).m_state = (SharedPtrStateBase *)0x0;
  this_00 = (Program *)operator_new(0x90);
  local_48.m_ptr = (this->super_Operation).super_Operation.m_event.m_ptr;
  local_48.m_state = (this->super_Operation).super_Operation.m_event.m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_58.m_ptr = (this->super_Operation).m_sync.m_ptr;
  local_58.m_state = (this->super_Operation).m_sync.m_state;
  if (local_58.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_58.m_state)->strongRefCount = (local_58.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_58.m_state)->weakRefCount = (local_58.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::Program::Program(this_00,&local_48,&local_58);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr(&local_38,this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator=(program,&local_38);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_38);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::release(&local_58);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator=(&this->m_program,program);
  return;
}

Assistant:

CreateProgram::CreateProgram (SharedPtr<Program>& program, bool useSync, bool serverSync)
	: Operation	("CreateProgram", useSync, serverSync)
{
	program = SharedPtr<Program>(new Program(getEvent(), getSync()));
	m_program = program;
}